

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void destStoreMonoLsb(QRasterBuffer *rasterBuffer,int x,int y,uint *buffer,int length)

{
  byte bVar1;
  QRgb QVar2;
  uchar *puVar3;
  int iVar4;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  QRasterBuffer *in_RDI;
  int in_R8D;
  int i_1;
  int i;
  uchar *data;
  int local_30;
  QRgb in_stack_ffffffffffffffd4;
  int iVar5;
  uint local_c;
  
  puVar3 = QRasterBuffer::scanLine(in_RDI,in_EDX);
  local_c = in_ESI;
  if ((in_RDI->monoDestinationWithClut & 1U) == 0) {
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
      iVar5 = qGray(in_stack_ffffffffffffffd4);
      iVar4 = (int)local_c >> 3;
      if (iVar5 < (int)qt_bayer_matrix[(int)(in_EDX & 0xf)][(int)(local_c & 0xf)]) {
        puVar3[iVar4] = puVar3[iVar4] | (byte)(1 << ((byte)local_c & 7));
      }
      else {
        puVar3[iVar4] = puVar3[iVar4] & ((byte)(1 << ((byte)local_c & 7)) ^ 0xff);
      }
      local_c = local_c + 1;
    }
  }
  else {
    for (iVar5 = 0; iVar5 < in_R8D; iVar5 = iVar5 + 1) {
      bVar1 = (byte)local_c;
      iVar4 = (int)local_c >> 3;
      if (*(QRgb *)(in_RCX + (long)iVar5 * 4) == in_RDI->destColor0) {
        puVar3[iVar4] = puVar3[iVar4] & ((byte)(1 << (bVar1 & 7)) ^ 0xff);
      }
      else if (*(QRgb *)(in_RCX + (long)iVar5 * 4) == in_RDI->destColor1) {
        puVar3[iVar4] = puVar3[iVar4] | (byte)(1 << (bVar1 & 7));
      }
      else {
        QVar2 = findNearestColor((QRgb)data,_i_1);
        if (QVar2 == in_RDI->destColor0) {
          puVar3[iVar4] = puVar3[iVar4] & ((byte)(1 << (bVar1 & 7)) ^ 0xff);
        }
        else {
          puVar3[iVar4] = puVar3[iVar4] | (byte)(1 << (bVar1 & 7));
        }
      }
      local_c = local_c + 1;
    }
  }
  return;
}

Assistant:

static void QT_FASTCALL destStoreMonoLsb(QRasterBuffer *rasterBuffer, int x, int y, const uint *buffer, int length)
{
    uchar *Q_DECL_RESTRICT data = (uchar *)rasterBuffer->scanLine(y);
    if (rasterBuffer->monoDestinationWithClut) {
        for (int i = 0; i < length; ++i) {
            if (buffer[i] == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else if (buffer[i] == rasterBuffer->destColor1) {
                data[x >> 3] |= 1 << (x & 7);
            } else if (findNearestColor(buffer[i], rasterBuffer) == rasterBuffer->destColor0) {
                data[x >> 3] &= ~(1 << (x & 7));
            } else {
                data[x >> 3] |= 1 << (x & 7);
            }
            ++x;
        }
    } else {
        for (int i = 0; i < length; ++i) {
            if (qGray(buffer[i]) < int(qt_bayer_matrix[y & 15][x & 15]))
                data[x >> 3] |= 1 << (x & 7);
            else
                data[x >> 3] &= ~(1 << (x & 7));
            ++x;
        }
    }
}